

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

BayesianProbitRegressor_FeatureValueWeight *
google::protobuf::internal::
GenericTypeHandler<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::New
          (Arena *arena)

{
  Arena *arena_local;
  BayesianProbitRegressor_FeatureValueWeight *local_28;
  BayesianProbitRegressor_FeatureValueWeight *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (BayesianProbitRegressor_FeatureValueWeight *)operator_new(0x20);
    CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
    BayesianProbitRegressor_FeatureValueWeight(local_28);
  }
  else {
    local_28 = (BayesianProbitRegressor_FeatureValueWeight *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
                                 typeinfo,0x20);
    CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
    BayesianProbitRegressor_FeatureValueWeight(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                      );
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }